

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parsedscene.cpp
# Opt level: O1

void __thiscall pbrt::ParsedScene::EndOfFiles(ParsedScene *this)

{
  pointer *ppTVar1;
  pointer pTVar2;
  GraphicsState *this_00;
  
  if (this->currentApiState != WorldBlock) {
    SceneRepresentation::ErrorExitDeferred<>
              (&this->super_SceneRepresentation,"End of files before \"WorldBegin\".");
  }
  if ((this->pushedGraphicsStates).
      super__Vector_base<pbrt::ParsedScene::GraphicsState,_std::allocator<pbrt::ParsedScene::GraphicsState>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      (this->pushedGraphicsStates).
      super__Vector_base<pbrt::ParsedScene::GraphicsState,_std::allocator<pbrt::ParsedScene::GraphicsState>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    do {
      SceneRepresentation::ErrorExitDeferred<>
                (&this->super_SceneRepresentation,"Missing end to AttributeBegin");
      this_00 = (this->pushedGraphicsStates).
                super__Vector_base<pbrt::ParsedScene::GraphicsState,_std::allocator<pbrt::ParsedScene::GraphicsState>_>
                ._M_impl.super__Vector_impl_data._M_finish + -1;
      (this->pushedGraphicsStates).
      super__Vector_base<pbrt::ParsedScene::GraphicsState,_std::allocator<pbrt::ParsedScene::GraphicsState>_>
      ._M_impl.super__Vector_impl_data._M_finish = this_00;
      GraphicsState::~GraphicsState(this_00);
      ppTVar1 = &(this->pushedTransforms).
                 super__Vector_base<pbrt::TransformSet,_std::allocator<pbrt::TransformSet>_>._M_impl
                 .super__Vector_impl_data._M_finish;
      *ppTVar1 = *ppTVar1 + -1;
    } while ((this->pushedGraphicsStates).
             super__Vector_base<pbrt::ParsedScene::GraphicsState,_std::allocator<pbrt::ParsedScene::GraphicsState>_>
             ._M_impl.super__Vector_impl_data._M_start !=
             (this->pushedGraphicsStates).
             super__Vector_base<pbrt::ParsedScene::GraphicsState,_std::allocator<pbrt::ParsedScene::GraphicsState>_>
             ._M_impl.super__Vector_impl_data._M_finish);
  }
  if ((this->pushedTransforms).
      super__Vector_base<pbrt::TransformSet,_std::allocator<pbrt::TransformSet>_>._M_impl.
      super__Vector_impl_data._M_start !=
      (this->pushedTransforms).
      super__Vector_base<pbrt::TransformSet,_std::allocator<pbrt::TransformSet>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    do {
      SceneRepresentation::ErrorExitDeferred<>
                (&this->super_SceneRepresentation,"Missing end to TransformBegin");
      pTVar2 = (this->pushedTransforms).
               super__Vector_base<pbrt::TransformSet,_std::allocator<pbrt::TransformSet>_>._M_impl.
               super__Vector_impl_data._M_finish + -1;
      (this->pushedTransforms).
      super__Vector_base<pbrt::TransformSet,_std::allocator<pbrt::TransformSet>_>._M_impl.
      super__Vector_impl_data._M_finish = pTVar2;
    } while ((this->pushedTransforms).
             super__Vector_base<pbrt::TransformSet,_std::allocator<pbrt::TransformSet>_>._M_impl.
             super__Vector_impl_data._M_start != pTVar2);
  }
  if ((this->super_SceneRepresentation).errorExit == true) {
    ErrorExit<>("Fatal errors during scene construction");
  }
  return;
}

Assistant:

void ParsedScene::EndOfFiles() {
    if (currentApiState != APIState::WorldBlock)
        ErrorExitDeferred("End of files before \"WorldBegin\".");

    // Ensure there are no pushed graphics states
    while (!pushedGraphicsStates.empty()) {
        ErrorExitDeferred("Missing end to AttributeBegin");
        pushedGraphicsStates.pop_back();
        pushedTransforms.pop_back();
    }
    while (!pushedTransforms.empty()) {
        ErrorExitDeferred("Missing end to TransformBegin");
        pushedTransforms.pop_back();
    }

    if (errorExit)
        ErrorExit("Fatal errors during scene construction");
}